

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O1

IterateResult __thiscall
glcts::MultisampleTextureTexStorage2DUnsupportedSamplesCountForColorTexturesTest::iterate
          (MultisampleTextureTexStorage2DUnsupportedSamplesCountForColorTexturesTest *this)

{
  undefined1 uVar1;
  undefined4 uVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  long lVar6;
  TestError *this_00;
  long lVar7;
  GLint gl_max_internalformat_samples_value;
  GLint gl_max_samples_value;
  GLint gl_max_color_texture_samples_value;
  int local_44 [3];
  long local_38;
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  local_44[2] = 0xffffffff;
  local_44[0] = -1;
  local_44[1] = 0xffffffff;
  lVar6 = 0;
  do {
    uVar2 = (&DAT_01b3b6a0)[lVar6];
    lVar7 = 0;
    local_38 = lVar6;
    do {
      uVar1 = (&DAT_01b3b6c0)[lVar7];
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
      (**(code **)(lVar5 + 0x868))(0x8d57,local_44 + 1);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Failed to retrieve GL_MAX_SAMPLES value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                      ,0x32e);
      (**(code **)(lVar5 + 0x868))(0x910e,local_44 + 2);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Failed to retrieve GL_MAX_COLOR_TEXTURE_SAMPLES value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                      ,0x333);
      (**(code **)(lVar5 + 0x880))(0x9100,uVar2,0x80a9,1,local_44);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glGetInternalformativ() failed to retrieve GL_SAMPLES",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                      ,0x338);
      (**(code **)(lVar5 + 0x1390))(0x9100,local_44[0] + 1,uVar2,1,1,uVar1);
      iVar3 = (**(code **)(lVar5 + 0x800))();
      if (iVar3 != 0x502) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,
                   "glTexStorage2DMultisample() did not generate GL_INVALID_OPERATION error.",
                   "gl.getError() == GL_INVALID_OPERATION",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                   ,0x340);
LAB_00c133d9:
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar5 + 0x1390))(0x9102,local_44[0] + 1,uVar2,1,1,uVar1);
      iVar3 = (**(code **)(lVar5 + 0x800))();
      if (iVar3 != 0x500) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"glTexStorage2DMultisample() did not generate GL_INVALID_ENUM error.",
                   "gl.getError() == GL_INVALID_ENUM",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                   ,0x34c);
        goto LAB_00c133d9;
      }
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    lVar6 = local_38 + 1;
    if (lVar6 == 5) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureTexStorage2DUnsupportedSamplesCountForColorTexturesTest::iterate()
{
	/* Test case variables */
	const glw::Functions& gl						  = m_context.getRenderContext().getFunctions();
	const glw::GLsizei	height					  = 1;
	const glw::GLboolean  fixedsamplelocations_list[] = { GL_FALSE, GL_TRUE };
	const int			  fixedsamplelocations_list_count =
		sizeof(fixedsamplelocations_list) / sizeof(fixedsamplelocations_list[0]);
	glw::GLint		   gl_max_color_texture_samples_value  = -1; /* Will be determined later */
	glw::GLint		   gl_max_internalformat_samples_value = -1; /* Will be determined later */
	glw::GLint		   gl_max_samples_value				   = -1; /* Will be determined later */
	const glw::GLenum  internalformat_list[]	 = { GL_R8, GL_RGB565, GL_RGB10_A2UI, GL_SRGB8_ALPHA8, GL_R8I };
	const int		   internalformat_list_count = sizeof(internalformat_list) / sizeof(internalformat_list[0]);
	const glw::GLenum  target = GL_TEXTURE_2D_MULTISAMPLE; /* Test case uses GL_TEXTURE_2D_MULTISAMPLE target */
	const glw::GLsizei width  = 1;

	/* Iterate through all internal formats test case should check */
	for (int internalformat_index = 0; internalformat_index < internalformat_list_count; internalformat_index++)
	{
		/* Iteration-specific internalformat */
		glw::GLenum internalformat = internalformat_list[internalformat_index];

		/* Iterate through all fixedsamplelocations test case should check */
		for (int fixedsamplelocations_index = 0; fixedsamplelocations_index < fixedsamplelocations_list_count;
			 fixedsamplelocations_index++)
		{
			/* Iteration-specific fixedsamplelocations */
			glw::GLboolean fixedsamplelocations = fixedsamplelocations_list[fixedsamplelocations_index];

			/* Initialize texture object and bind it to GL_TEXTURE_2D_MULTISAMPLE target */
			initInternalIteration();

			/* Get GL_MAX_SAMPLES value */
			gl.getIntegerv(GL_MAX_SAMPLES, &gl_max_samples_value);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to retrieve GL_MAX_SAMPLES value");

			/* Get GL_MAX_COLOR_TEXTURE_SAMPLES value */
			gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &gl_max_color_texture_samples_value);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to retrieve GL_MAX_COLOR_TEXTURE_SAMPLES value");

			/* Retrieve maximum amount of samples available for the texture target considered */
			gl.getInternalformativ(target, internalformat, GL_SAMPLES, 1, &gl_max_internalformat_samples_value);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() failed to retrieve GL_SAMPLES");

			/* Issue call with valid parameters, but samples argument might be invalid */
			gl.texStorage2DMultisample(target, gl_max_internalformat_samples_value + 1, internalformat, width, height,
									   fixedsamplelocations);

			/* Expect GL_INVALID_OPERATION error code. */
			TCU_CHECK_MSG(gl.getError() == GL_INVALID_OPERATION,
						  "glTexStorage2DMultisample() did not generate GL_INVALID_OPERATION error.");

			/* Issue call with valid parameters, but to another target GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES and with invalid samples.
			 *
			 * NOTE: This can be executed on both the implementations that support GL_OES_texture_storage_multisample_2d_array extension
			 *       and on those that don't.
			 */
			gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, gl_max_internalformat_samples_value + 1,
									   internalformat, width, height, fixedsamplelocations);

			/* Expect GL_INVALID_ENUM error code from invalid target. */
			TCU_CHECK_MSG(gl.getError() == GL_INVALID_ENUM,
						  "glTexStorage2DMultisample() did not generate GL_INVALID_ENUM error.");

			/* Deinitialize texture object and unbind texture object bound to GL_TEXTURE_2D_MULTISAMPLE target */
			deinitInternalIteration();
		}
	}

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}